

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

string * __thiscall
BCLog::Logger::LogLevelToStr_abi_cxx11_(string *__return_storage_ptr__,Logger *this,Level level)

{
  allocator<char> *__a;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "trace";
    __a = &local_11;
    break;
  case 1:
    __s = "debug";
    __a = &local_12;
    break;
  case 2:
    __s = "info";
    __a = &local_13;
    break;
  case 3:
    __s = "warning";
    __a = &local_14;
    break;
  case 4:
    __s = "error";
    __a = &local_15;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp"
                  ,0xf4,"static std::string BCLog::Logger::LogLevelToStr(BCLog::Level)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BCLog::Logger::LogLevelToStr(BCLog::Level level)
{
    switch (level) {
    case BCLog::Level::Trace:
        return "trace";
    case BCLog::Level::Debug:
        return "debug";
    case BCLog::Level::Info:
        return "info";
    case BCLog::Level::Warning:
        return "warning";
    case BCLog::Level::Error:
        return "error";
    }
    assert(false);
}